

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::StartObject(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this)

{
  Level *this_00;
  bool bVar1;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  Level *ret;
  Stack<rapidjson::CrtAllocator> *this_01;
  undefined8 in_stack_ffffffffffffffc8;
  long lVar2;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_stack_ffffffffffffffd0;
  
  this_01 = in_RDI;
  Prefix(in_stack_ffffffffffffffd0,(Type)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  lVar2 = 1;
  if ((long)(in_RDI->initialCapacity_ - (long)in_RDI->stackEnd_) < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
              (this_01,(size_t)&in_RDI->ownAllocator_);
  }
  this_00 = (Level *)in_RDI->stackEnd_;
  in_RDI->stackEnd_ = in_RDI->stackEnd_ + lVar2 * 0x10;
  Level::Level(this_00,false);
  bVar1 = WriteStartObject((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                            *)0x1c52ec);
  return bVar1;
}

Assistant:

bool StartObject() {
        Prefix(kObjectType);
        new (level_stack_.template Push<Level>()) Level(false);
        return WriteStartObject();
    }